

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int cs_impl::file_system::mkdir(char *__path,__mode_t __mode)

{
  bool bVar1;
  reference pcVar2;
  undefined7 extraout_var;
  char *ch;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  char *local_10;
  char *local_8;
  
  local_10 = __path;
  local_8 = __path;
  local_18._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)__path,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_18);
    if (*pcVar2 == '\\') {
      *pcVar2 = '/';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_18);
  }
  bVar1 = cs_system_impl::mkdir_impl((string *)__path,in_stack_ffffffffffffffcc);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool mkdir(std::string path)
		{
			for (auto &ch: path) {
				if (ch == path_separator_reversed)
					ch = cs::path_separator;
			}
			return cs_system_impl::mkdir_impl(path, 0755);
		}